

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void __thiscall CodeGenGenericContext::KillRegister(CodeGenGenericContext *this,x86XmmReg reg)

{
  if (this->xmmRegRead[reg] == false) {
    if (this->x86Base[this->xmmRegUpdate[reg]].name != o_none) {
      this->x86Base[this->xmmRegUpdate[reg]].name = o_none;
      this->optimizationCount = this->optimizationCount + 1;
    }
  }
  this->xmmReg[reg].type = argNone;
  return;
}

Assistant:

void CodeGenGenericContext::KillRegister(x86XmmReg reg)
{
	// Eliminate dead stores to the register
	if(!xmmRegRead[reg])
	{
		x86Instruction *curr = xmmRegUpdate[reg] + x86Base;

		if(curr->name != o_none)
		{
			curr->name = o_none;
			optimizationCount++;
		}
	}

	// Invalidate the register value
	xmmReg[reg].type = x86Argument::argNone;
}